

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O0

uint8_t * bstr_match_pair(uint8_t *pBegin,uint8_t *pEnd,uint8_t left,uint8_t right,
                         uint8_t escapeChar)

{
  uint8_t uVar1;
  bool bVar2;
  int local_34;
  uint8_t c_1;
  uint8_t c;
  uint8_t isEscape;
  uint8_t *puStack_30;
  uint32_t innerLevelCount;
  uint8_t *pNext;
  uint8_t escapeChar_local;
  uint8_t right_local;
  uint8_t left_local;
  uint8_t *pEnd_local;
  uint8_t *pBegin_local;
  
  local_34 = 0;
  pBegin_local = pBegin;
  if (pBegin < pEnd) {
    if (*pBegin == left) {
      puStack_30 = pBegin + 1;
      if (escapeChar == '\0') {
        for (; puStack_30 < pEnd; puStack_30 = puStack_30 + 1) {
          if (*puStack_30 == right) {
            if (local_34 == 0) {
              return puStack_30;
            }
            local_34 = local_34 + -1;
          }
          else if (*puStack_30 == left) {
            local_34 = local_34 + 1;
          }
        }
      }
      else {
        bVar2 = false;
        while (puStack_30 < pEnd) {
          uVar1 = *puStack_30;
          if (bVar2) {
            puStack_30 = puStack_30 + 1;
            bVar2 = false;
          }
          else {
            if (uVar1 == escapeChar) {
              bVar2 = true;
            }
            else if (uVar1 == right) {
              if (local_34 == 0) {
                return puStack_30;
              }
              local_34 = local_34 + -1;
            }
            else if (uVar1 == left) {
              local_34 = local_34 + 1;
            }
            puStack_30 = puStack_30 + 1;
          }
        }
      }
    }
    else {
      pBegin_local = (uint8_t *)0x0;
    }
  }
  return pBegin_local;
}

Assistant:

const uint8_t *bstr_match_pair(const uint8_t *pBegin, const uint8_t *pEnd, uint8_t left, uint8_t right, uint8_t escapeChar){
   const uint8_t *pNext = pBegin;
   uint32_t innerLevelCount=0;
   if (pNext < pEnd){
      if (*pNext == left){
         pNext++;
         if (escapeChar != 0){
            uint8_t isEscape = 0;
            while (pNext < pEnd){
               uint8_t c = *pNext;
               if (isEscape != 0){
                  //ignore this char
                  pNext++;
                  isEscape = 0;
                  continue;
               }
               else {
                  if ( c == escapeChar ){
                     isEscape = 1;
                  }
                  else if (c == right){
                     if (innerLevelCount == 0) {
                        return pNext;
                     }
                     else {
                        innerLevelCount--;
                     }
                  }
                  else if ( c == left )
                  {
                     innerLevelCount++;
                  }
               }
               pNext++;
            }
         }
         else{
            while (pNext < pEnd) {
               uint8_t c = *pNext;
               if (c == right){
                  if (innerLevelCount == 0) {
                     return pNext;
                  }
                  else {
                     innerLevelCount--;
                  }
               }
               else if (c == left)
               {
                  innerLevelCount++;
               }
               pNext++;
            }
         }
      }
      else
      {
         return 0; //string does not start with \par left character
      }
   }
   return pBegin;
}